

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z2_Nx8_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [32];
  uint uVar16;
  int iVar17;
  int iVar18;
  long in_RCX;
  long in_RDX;
  undefined2 in_SI;
  undefined6 in_register_00000032;
  int in_EDI;
  undefined2 in_R8W;
  undefined6 in_register_00000082;
  uint in_R9D;
  undefined1 auVar19 [16];
  byte bStack0000000000000008;
  __m128i mask128;
  __m128i base_y_c128;
  __m128i y_c128;
  __m128i dy128;
  __m128i c1234;
  __m128i r6;
  int16_t base_y_c [8];
  __m128i shifty;
  __m128i a1_y;
  __m128i a0_y;
  __m128i atmp3;
  __m128i atmp2;
  __m128i atmp1;
  __m128i atmp0;
  __m128i mask;
  int base_min_diff;
  int base_shift;
  int base_x;
  int y;
  __m128i resxy;
  __m128i resy;
  __m128i resx;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i a16;
  __m256i a32;
  __m256i diff;
  __m256i a1_x;
  __m256i a0_x;
  __m128i min_base_y128;
  __m128i c3f;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  short local_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  short sStack_ad8;
  short sStack_ad6;
  short sStack_ad4;
  short sStack_ad2;
  undefined1 local_ac0 [16];
  int local_a40;
  int local_a3c;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined1 local_a00 [32];
  int local_984;
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [76];
  ushort local_894;
  byte local_88c;
  undefined8 *local_870;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  
  local_870 = (undefined8 *)CONCAT62(in_register_00000032,in_SI);
  lVar11 = CONCAT62(in_register_00000082,in_R8W);
  local_88c = (byte)in_R9D;
  iVar18 = -(1 << (local_88c & 0x1f));
  uVar16 = -(1 << (bStack0000000000000008 & 0x1f));
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar2 = vpinsrw_avx(auVar2,0x10,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar3 = vpinsrw_avx(auVar3,0x10,2);
  auVar3 = vpinsrw_avx(auVar3,0x10,3);
  auVar3 = vpinsrw_avx(auVar3,0x10,4);
  auVar3 = vpinsrw_avx(auVar3,0x10,5);
  auVar3 = vpinsrw_avx(auVar3,0x10,6);
  auVar3 = vpinsrw_avx(auVar3,0x10,7);
  uStack_5f0 = auVar3._0_8_;
  uStack_5e8 = auVar3._8_8_;
  auVar3 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar3 = vpinsrw_avx(auVar3,0x3f,2);
  auVar3 = vpinsrw_avx(auVar3,0x3f,3);
  auVar3 = vpinsrw_avx(auVar3,0x3f,4);
  auVar3 = vpinsrw_avx(auVar3,0x3f,5);
  auVar3 = vpinsrw_avx(auVar3,0x3f,6);
  auVar3 = vpinsrw_avx(auVar3,0x3f,7);
  local_894 = (ushort)uVar16;
  auVar4 = vpinsrw_avx(ZEXT216(local_894),uVar16 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar16 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar16 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar16 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar16 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar16 & 0xffff,6);
  auVar4 = vpinsrw_avx(auVar4,uVar16 & 0xffff,7);
  for (local_984 = 0; local_984 < in_EDI; local_984 = local_984 + 1) {
    iVar17 = -(local_984 + 1) * upsample_left >> (6 - local_88c & 0x1f);
    local_a3c = 0;
    if (iVar17 < iVar18 + -1) {
      local_a3c = (iVar18 - iVar17) + -1 >> (local_88c & 0x1f);
    }
    local_a40 = (int)((iVar18 - iVar17) + in_R9D) >> (local_88c & 0x1f);
    if (local_a40 < 9) {
      if (local_a40 < 0) {
        local_a40 = 0;
      }
    }
    else {
      local_a40 = 8;
    }
    if (local_a3c < 8) {
      auVar19 = *(undefined1 (*) [16])(in_RCX + (long)iVar17 * 2 + (long)local_a3c * 2);
      sVar12 = (short)upsample_left;
      sVar14 = (short)(local_984 + 1);
      if (in_R9D == 0) {
        local_970 = vpshufb_avx(auVar19,(undefined1  [16])HighbdLoadMaskx[local_a3c]);
        local_980 = vpshufb_avx(*(undefined1 (*) [16])
                                 (in_RCX + (long)iVar17 * 2 + 2 + (long)local_a3c * 2),
                                (undefined1  [16])HighbdLoadMaskx[local_a3c]);
        sVar13 = sVar14 * sVar12;
        auVar19 = vpinsrw_avx(ZEXT216((ushort)(-sVar14 * sVar12)),(uint)(ushort)(0x40 - sVar13),1);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x80 - sVar13),2);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0xc0 - sVar13),3);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x100 - sVar13),4);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x140 - sVar13),5);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x180 - sVar13),6);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x1c0 - sVar13),7);
        auVar19 = vpand_avx(auVar19,auVar3);
        auVar19 = vpsrlw_avx(auVar19,ZEXT416(1));
      }
      else {
        pauVar1 = (undefined1 (*) [16])(in_RCX + (long)iVar17 * 2 + 0x10 + (long)local_a3c * 2);
        auVar5 = vpshufb_avx(auVar19,*(undefined1 (*) [16])HighbdEvenOddMaskx[local_a3c]);
        auVar6 = vpshufb_avx(*pauVar1,*(undefined1 (*) [16])HighbdEvenOddMaskx[local_a3c]);
        auVar7 = vpshufb_avx(auVar19,*(undefined1 (*) [16])(HighbdEvenOddMaskx[local_a3c] + 0x10));
        auVar8 = vpshufb_avx(*pauVar1,*(undefined1 (*) [16])(HighbdEvenOddMaskx[local_a3c] + 0x10));
        auVar19 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar19 = vpinsrb_avx(auVar19,0xf,2);
        auVar19 = vpinsrb_avx(auVar19,0xf,3);
        auVar19 = vpinsrb_avx(auVar19,0xf,4);
        auVar19 = vpinsrb_avx(auVar19,0xf,5);
        auVar19 = vpinsrb_avx(auVar19,0xf,6);
        auVar19 = vpinsrb_avx(auVar19,0xf,7);
        auVar19 = vpinsrb_avx(auVar19,0xf,8);
        auVar19 = vpinsrb_avx(auVar19,0xf,9);
        auVar19 = vpinsrb_avx(auVar19,0xf,10);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xb);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xc);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xd);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xe);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xf);
        auVar19 = vpcmpgtb_avx(*(undefined1 (*) [16])HighbdEvenOddMaskx[local_a3c],auVar19);
        local_970 = vpblendvb_avx(auVar5,auVar6,auVar19);
        auVar19 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar19 = vpinsrb_avx(auVar19,0xf,2);
        auVar19 = vpinsrb_avx(auVar19,0xf,3);
        auVar19 = vpinsrb_avx(auVar19,0xf,4);
        auVar19 = vpinsrb_avx(auVar19,0xf,5);
        auVar19 = vpinsrb_avx(auVar19,0xf,6);
        auVar19 = vpinsrb_avx(auVar19,0xf,7);
        auVar19 = vpinsrb_avx(auVar19,0xf,8);
        auVar19 = vpinsrb_avx(auVar19,0xf,9);
        auVar19 = vpinsrb_avx(auVar19,0xf,10);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xb);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xc);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xd);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xe);
        auVar19 = vpinsrb_avx(auVar19,0xf,0xf);
        auVar19 = vpcmpgtb_avx(*(undefined1 (*) [16])(HighbdEvenOddMaskx[local_a3c] + 0x10),auVar19)
        ;
        local_980 = vpblendvb_avx(auVar7,auVar8,auVar19);
        sVar13 = sVar14 * sVar12;
        auVar19 = vpinsrw_avx(ZEXT216((ushort)(-sVar14 * sVar12)),(uint)(ushort)(0x40 - sVar13),1);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x80 - sVar13),2);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0xc0 - sVar13),3);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x100 - sVar13),4);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x140 - sVar13),5);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x180 - sVar13),6);
        auVar19 = vpinsrw_avx(auVar19,(uint)(ushort)(0x1c0 - sVar13),7);
        auVar19 = vpsllw_avx(auVar19,ZEXT416(in_R9D));
        auVar19 = vpand_avx(auVar19,auVar3);
        auVar19 = vpsrlw_avx(auVar19,ZEXT416(1));
      }
      local_8e0._16_16_ = auVar19;
      local_8e0._0_16_ = local_970;
    }
    else {
      local_8e0._0_16_ = ZEXT816(0);
      local_8e0._0_32_ = ZEXT1632(local_8e0._0_16_);
      local_900._0_16_ = ZEXT816(0);
      local_a00._0_16_ = ZEXT816(0);
      local_980 = local_900._0_16_;
      auVar19 = local_a00._0_16_;
    }
    local_a00 = ZEXT1632(auVar19);
    local_900 = ZEXT1632(local_980);
    if (iVar17 < iVar18) {
      uVar16 = local_984 << 6;
      auVar5 = vpinsrw_avx(ZEXT216((ushort)uVar16),uVar16 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,uVar16 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,uVar16 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,uVar16 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,uVar16 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,uVar16 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,uVar16 & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216((ushort)dx),dx & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,dx & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,dx & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,dx & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,dx & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,dx & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,dx & 0xffff,7);
      auVar7 = vpinsrw_avx(ZEXT216(1),2,1);
      auVar7 = vpinsrw_avx(auVar7,3,2);
      auVar7 = vpinsrw_avx(auVar7,4,3);
      auVar7 = vpinsrw_avx(auVar7,5,4);
      auVar7 = vpinsrw_avx(auVar7,6,5);
      auVar7 = vpinsrw_avx(auVar7,7,6);
      auVar7 = vpinsrw_avx(auVar7,8,7);
      auVar6 = vpmullw_avx(auVar7,auVar6);
      auVar7 = vpsubw_avx(auVar5,auVar6);
      auVar6 = vpsraw_avx(auVar7,ZEXT416(6 - _bStack0000000000000008));
      auVar5 = vpcmpgtw_avx(auVar4,auVar6);
      auVar5 = vpandn_avx(auVar5,auVar6);
      sStack_ada = auVar5._6_2_;
      sStack_adc = auVar5._4_2_;
      sStack_ade = auVar5._2_2_;
      local_ae0 = auVar5._0_2_;
      sStack_ad2 = auVar5._14_2_;
      sStack_ad4 = auVar5._12_2_;
      sStack_ad6 = auVar5._10_2_;
      sStack_ad8 = auVar5._8_2_;
      auVar5 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar11 + (long)local_ae0 * 2)),
                           (uint)*(ushort *)(lVar11 + (long)sStack_ade * 2),1);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar11 + (long)sStack_adc * 2),2);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar11 + (long)sStack_ada * 2),3);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar11 + (long)sStack_ad8 * 2),4);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar11 + (long)sStack_ad6 * 2),5);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar11 + (long)sStack_ad4 * 2),6);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar11 + (long)sStack_ad2 * 2),7);
      auVar6 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar11 + 2 + (long)local_ae0 * 2)),
                           (uint)*(ushort *)(lVar11 + 2 + (long)sStack_ade * 2),1);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(lVar11 + 2 + (long)sStack_adc * 2),2);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(lVar11 + 2 + (long)sStack_ada * 2),3);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(lVar11 + 2 + (long)sStack_ad8 * 2),4);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(lVar11 + 2 + (long)sStack_ad6 * 2),5);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(lVar11 + 2 + (long)sStack_ad4 * 2),6);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)(lVar11 + 2 + (long)sStack_ad2 * 2),7);
      if (_bStack0000000000000008 == 0) {
        auVar7 = vpand_avx(auVar7,auVar3);
        local_ac0 = vpsrlw_avx(auVar7,ZEXT416(1));
      }
      else {
        auVar7 = vpsllw_avx(auVar7,ZEXT416(_bStack0000000000000008));
        auVar7 = vpand_avx(auVar7,auVar3);
        local_ac0 = vpsrlw_avx(auVar7,ZEXT416(1));
      }
      auVar7 = local_8e0._16_16_;
      local_8e0._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * local_8e0._0_16_;
      local_8e0._16_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar5;
      local_900._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * local_980;
      local_900._16_16_ = ZEXT116(1) * auVar6;
      local_a00._0_16_ = ZEXT116(0) * local_ac0 + ZEXT116(1) * auVar19;
      local_a00._16_16_ = ZEXT116(1) * local_ac0;
    }
    auVar10 = vpsubw_avx2(local_900,local_8e0._0_32_);
    auVar9 = vpsllw_avx2(local_8e0._0_32_,ZEXT416(5));
    auVar15._16_8_ = uStack_5f0;
    auVar15._0_16_ = auVar2;
    auVar15._24_8_ = uStack_5e8;
    auVar9 = vpaddw_avx2(auVar9,auVar15);
    auVar10 = vpmullw_avx2(auVar10,local_a00);
    auVar9 = vpaddw_avx2(auVar9,auVar10);
    auVar9 = vpsrlw_avx2(auVar9,ZEXT416(5));
    auVar19 = vpblendvb_avx(auVar9._0_16_,auVar9._16_16_,
                            *(undefined1 (*) [16])HighbdBaseMask[local_a40]);
    local_a30 = auVar19._0_8_;
    uStack_a28 = auVar19._8_8_;
    *local_870 = local_a30;
    local_870[1] = uStack_a28;
    local_870 = (undefined8 *)(in_RDX * 2 + (long)local_870);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z2_Nx8_avx2(
    int N, uint16_t *dst, ptrdiff_t stride, const uint16_t *above,
    const uint16_t *left, int upsample_above, int upsample_left, int dx,
    int dy) {
  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m128i c3f, min_base_y128;
  __m256i a0_x, a1_x, diff, a32, a16;
  __m128i a0_x128, a1_x128;

  a16 = _mm256_set1_epi16(16);
  c3f = _mm_set1_epi16(0x3f);
  min_base_y128 = _mm_set1_epi16(min_base_y);

  for (int r = 0; r < N; r++) {
    __m256i b, res, shift;
    __m128i resx, resy, resxy;
    int y = r + 1;
    int base_x = (-y * dx) >> frac_bits_x;
    int base_shift = 0;
    if (base_x < (min_base_x - 1)) {
      base_shift = (min_base_x - base_x - 1) >> upsample_above;
    }
    int base_min_diff =
        (min_base_x - base_x + upsample_above) >> upsample_above;
    if (base_min_diff > 8) {
      base_min_diff = 8;
    } else {
      if (base_min_diff < 0) base_min_diff = 0;
    }

    if (base_shift > 7) {
      a0_x = _mm256_setzero_si256();
      a1_x = _mm256_setzero_si256();
      shift = _mm256_setzero_si256();
    } else {
      a0_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift));
      if (upsample_above) {
        __m128i mask, atmp0, atmp1, atmp2, atmp3;
        a1_x128 = _mm_loadu_si128((__m128i *)(above + base_x + 8 + base_shift));
        atmp0 = _mm_shuffle_epi8(a0_x128,
                                 *(__m128i *)HighbdEvenOddMaskx[base_shift]);
        atmp1 = _mm_shuffle_epi8(a1_x128,
                                 *(__m128i *)HighbdEvenOddMaskx[base_shift]);
        atmp2 = _mm_shuffle_epi8(
            a0_x128, *(__m128i *)(HighbdEvenOddMaskx[base_shift] + 16));
        atmp3 = _mm_shuffle_epi8(
            a1_x128, *(__m128i *)(HighbdEvenOddMaskx[base_shift] + 16));
        mask = _mm_cmpgt_epi8(*(__m128i *)HighbdEvenOddMaskx[base_shift],
                              _mm_set1_epi8(15));
        a0_x128 = _mm_blendv_epi8(atmp0, atmp1, mask);
        mask = _mm_cmpgt_epi8(*(__m128i *)(HighbdEvenOddMaskx[base_shift] + 16),
                              _mm_set1_epi8(15));
        a1_x128 = _mm_blendv_epi8(atmp2, atmp3, mask);

        shift = _mm256_castsi128_si256(_mm_srli_epi16(
            _mm_and_si128(
                _mm_slli_epi16(
                    _mm_setr_epi16(-y * dx, (1 << 6) - y * dx,
                                   (2 << 6) - y * dx, (3 << 6) - y * dx,
                                   (4 << 6) - y * dx, (5 << 6) - y * dx,
                                   (6 << 6) - y * dx, (7 << 6) - y * dx),
                    upsample_above),
                c3f),
            1));
      } else {
        a1_x128 = _mm_loadu_si128((__m128i *)(above + base_x + 1 + base_shift));
        a0_x128 =
            _mm_shuffle_epi8(a0_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);
        a1_x128 =
            _mm_shuffle_epi8(a1_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);

        shift = _mm256_castsi128_si256(_mm_srli_epi16(
            _mm_and_si128(_mm_setr_epi16(-y * dx, (1 << 6) - y * dx,
                                         (2 << 6) - y * dx, (3 << 6) - y * dx,
                                         (4 << 6) - y * dx, (5 << 6) - y * dx,
                                         (6 << 6) - y * dx, (7 << 6) - y * dx),
                          c3f),
            1));
      }
      a0_x = _mm256_castsi128_si256(a0_x128);
      a1_x = _mm256_castsi128_si256(a1_x128);
    }

    // y calc
    __m128i a0_y, a1_y, shifty;
    if (base_x < min_base_x) {
      DECLARE_ALIGNED(32, int16_t, base_y_c[8]);
      __m128i r6, c1234, dy128, y_c128, base_y_c128, mask128;
      r6 = _mm_set1_epi16(r << 6);
      dy128 = _mm_set1_epi16(dy);
      c1234 = _mm_setr_epi16(1, 2, 3, 4, 5, 6, 7, 8);
      y_c128 = _mm_sub_epi16(r6, _mm_mullo_epi16(c1234, dy128));
      base_y_c128 = _mm_srai_epi16(y_c128, frac_bits_y);
      mask128 = _mm_cmpgt_epi16(min_base_y128, base_y_c128);
      base_y_c128 = _mm_andnot_si128(mask128, base_y_c128);
      _mm_store_si128((__m128i *)base_y_c, base_y_c128);

      a0_y = _mm_setr_epi16(left[base_y_c[0]], left[base_y_c[1]],
                            left[base_y_c[2]], left[base_y_c[3]],
                            left[base_y_c[4]], left[base_y_c[5]],
                            left[base_y_c[6]], left[base_y_c[7]]);
      a1_y = _mm_setr_epi16(left[base_y_c[0] + 1], left[base_y_c[1] + 1],
                            left[base_y_c[2] + 1], left[base_y_c[3] + 1],
                            left[base_y_c[4] + 1], left[base_y_c[5] + 1],
                            left[base_y_c[6] + 1], left[base_y_c[7] + 1]);

      if (upsample_left) {
        shifty = _mm_srli_epi16(
            _mm_and_si128(_mm_slli_epi16((y_c128), upsample_left), c3f), 1);
      } else {
        shifty = _mm_srli_epi16(_mm_and_si128(y_c128, c3f), 1);
      }
      a0_x = _mm256_inserti128_si256(a0_x, a0_y, 1);
      a1_x = _mm256_inserti128_si256(a1_x, a1_y, 1);
      shift = _mm256_inserti128_si256(shift, shifty, 1);
    }

    diff = _mm256_sub_epi16(a1_x, a0_x);  // a[x+1] - a[x]
    a32 = _mm256_slli_epi16(a0_x, 5);     // a[x] * 32
    a32 = _mm256_add_epi16(a32, a16);     // a[x] * 32 + 16

    b = _mm256_mullo_epi16(diff, shift);
    res = _mm256_add_epi16(a32, b);
    res = _mm256_srli_epi16(res, 5);

    resx = _mm256_castsi256_si128(res);
    resy = _mm256_extracti128_si256(res, 1);

    resxy =
        _mm_blendv_epi8(resx, resy, *(__m128i *)HighbdBaseMask[base_min_diff]);
    _mm_storeu_si128((__m128i *)(dst), resxy);
    dst += stride;
  }
}